

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O1

int newhp(void)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  if (u.ulevel == 0) {
    iVar3 = (int)urace.hpadv.infix + (int)urole.hpadv.infix;
    uVar6 = (uint)urole.hpadv.inrnd;
    if ('\0' < urole.hpadv.inrnd) {
      uVar2 = mt_random();
      iVar3 = iVar3 + uVar2 % uVar6 + 1;
    }
    uVar6 = (uint)urace.hpadv.inrnd;
    if ('\0' < urace.hpadv.inrnd) {
      uVar2 = mt_random();
      iVar3 = iVar3 + uVar2 % uVar6 + 1;
    }
    u.ualign.type = aligns[u.initalign].value;
    u.ualign.record = (int)urole.initrecord;
  }
  else {
    if (u.ulevel < urole.xlev) {
      iVar5 = (int)urace.hpadv.lofix + (int)urole.hpadv.lofix;
      uVar6 = (uint)urole.hpadv.lornd;
      bVar1 = urace.hpadv.lornd;
      if ('\0' < urole.hpadv.lornd) {
        uVar2 = mt_random();
        iVar5 = iVar5 + uVar2 % uVar6 + 1;
        bVar1 = urace.hpadv.lornd;
      }
    }
    else {
      iVar5 = (int)urace.hpadv.hifix + (int)urole.hpadv.hifix;
      uVar6 = (uint)urole.hpadv.hirnd;
      bVar1 = urace.hpadv.hirnd;
      if ('\0' < urole.hpadv.hirnd) {
        uVar2 = mt_random();
        iVar5 = iVar5 + uVar2 % uVar6 + 1;
        bVar1 = urace.hpadv.hirnd;
      }
    }
    if ('\0' < (char)bVar1) {
      uVar6 = mt_random();
      iVar5 = iVar5 + uVar6 % (uint)bVar1 + 1;
    }
    iVar3 = (int)u.acurr.a[4] + (int)u.atemp.a[4] + (int)u.abon.a[4];
    iVar4 = -2;
    if (((3 < iVar3) && (iVar4 = -1, 6 < iVar3)) && (iVar4 = 0, 0xe < iVar3)) {
      iVar4 = 1;
      if ((0x10 < iVar3) && (iVar4 = 2, iVar3 != 0x11)) {
        iVar4 = (iVar3 != 0x12) + 3;
      }
    }
    iVar3 = 1;
    if (1 < iVar4 + iVar5) {
      iVar3 = iVar4 + iVar5;
    }
  }
  return iVar3;
}

Assistant:

int newhp(void)
{
	int	hp, conplus;


	if (u.ulevel == 0) {
	    /* Initialize hit points */
	    hp = urole.hpadv.infix + urace.hpadv.infix;
	    if (urole.hpadv.inrnd > 0) hp += rnd(urole.hpadv.inrnd);
	    if (urace.hpadv.inrnd > 0) hp += rnd(urace.hpadv.inrnd);

	    /* Initialize alignment stuff */
	    u.ualign.type = aligns[u.initalign].value;
	    u.ualign.record = urole.initrecord;

		return hp;
	} else {
	    if (u.ulevel < urole.xlev) {
	    	hp = urole.hpadv.lofix + urace.hpadv.lofix;
	    	if (urole.hpadv.lornd > 0) hp += rnd(urole.hpadv.lornd);
	    	if (urace.hpadv.lornd > 0) hp += rnd(urace.hpadv.lornd);
	    } else {
	    	hp = urole.hpadv.hifix + urace.hpadv.hifix;
	    	if (urole.hpadv.hirnd > 0) hp += rnd(urole.hpadv.hirnd);
	    	if (urace.hpadv.hirnd > 0) hp += rnd(urace.hpadv.hirnd);
	    }
	}

	if (ACURR(A_CON) <= 3) conplus = -2;
	else if (ACURR(A_CON) <= 6) conplus = -1;
	else if (ACURR(A_CON) <= 14) conplus = 0;
	else if (ACURR(A_CON) <= 16) conplus = 1;
	else if (ACURR(A_CON) == 17) conplus = 2;
	else if (ACURR(A_CON) == 18) conplus = 3;
	else conplus = 4;
	
	hp += conplus;
	return (hp <= 0) ? 1 : hp;
}